

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

int cmd_verb(char *arg)

{
  int iVar1;
  size_t sVar2;
  char *__s1;
  undefined8 uVar3;
  
  sVar2 = strlen(arg);
  if (sVar2 < 5) {
    puts("verb (error/0 | warning/1 | verbose/2 | debug/3)");
    return 1;
  }
  __s1 = arg + 5;
  iVar1 = strcmp(__s1,"error");
  if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"0"), iVar1 == 0)) {
    ly_verb(0);
  }
  else {
    iVar1 = strcmp(__s1,"warning");
    if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"1"), iVar1 == 0)) {
      uVar3 = 1;
    }
    else {
      iVar1 = strcmp(__s1,"verbose");
      if ((iVar1 != 0) && (iVar1 = strcmp(__s1,"2"), iVar1 != 0)) {
        iVar1 = strcmp(__s1,"debug");
        if ((iVar1 != 0) && (iVar1 = strcmp(__s1,"3"), iVar1 != 0)) {
          fprintf(_stderr,"Unknown verbosity \"%s\"\n",__s1);
          return 1;
        }
        ly_verb(3);
        ly_verb_dbg(0x1f);
        return 0;
      }
      uVar3 = 2;
    }
    ly_verb(uVar3);
  }
  ly_verb_dbg(0);
  return 0;
}

Assistant:

int
cmd_verb(const char *arg)
{
    const char *verb;
    if (strlen(arg) < 5) {
        cmd_verb_help();
        return 1;
    }

    verb = arg + 5;
    if (!strcmp(verb, "error") || !strcmp(verb, "0")) {
        ly_verb(LY_LLERR);
#ifndef NDEBUG
        ly_verb_dbg(0);
#endif
    } else if (!strcmp(verb, "warning") || !strcmp(verb, "1")) {
        ly_verb(LY_LLWRN);
#ifndef NDEBUG
        ly_verb_dbg(0);
#endif
    } else if (!strcmp(verb, "verbose")  || !strcmp(verb, "2")) {
        ly_verb(LY_LLVRB);
#ifndef NDEBUG
        ly_verb_dbg(0);
#endif
    } else if (!strcmp(verb, "debug")  || !strcmp(verb, "3")) {
        ly_verb(LY_LLDBG);
#ifndef NDEBUG
        ly_verb_dbg(LY_LDGDICT | LY_LDGYANG | LY_LDGYIN | LY_LDGXPATH | LY_LDGDIFF);
#endif
    } else {
        fprintf(stderr, "Unknown verbosity \"%s\"\n", verb);
        return 1;
    }

    return 0;
}